

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

int lest::repeat(text *opt,text *arg)

{
  pointer pcVar1;
  long lVar2;
  runtime_error *this;
  long *plVar3;
  size_type *psVar4;
  long *plVar5;
  runtime_error local_e0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  char *local_50 [2];
  char local_40 [16];
  
  pcVar1 = (arg->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + arg->_M_string_length);
  lVar2 = strtol(local_50[0],(char **)0x0,10);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (-2 < (int)lVar2) {
    return (int)lVar2;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_90,"expecting \'-1\' or positive number with option \'",opt);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_d0._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_d0._M_dataplus._M_p == psVar4) {
    local_d0.field_2._M_allocated_capacity = *psVar4;
    local_d0.field_2._8_8_ = plVar3[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar4;
  }
  local_d0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::operator+(&local_70,&local_d0,arg);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_b0 = (long *)*plVar3;
  plVar5 = plVar3 + 2;
  if (local_b0 == plVar5) {
    local_a0 = *plVar5;
    lStack_98 = plVar3[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar5;
  }
  local_a8 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(local_e0,(string *)&local_b0);
  std::runtime_error::runtime_error(this,local_e0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline int repeat( text opt, text arg )
{
    const int num = lest::stoi( arg );

    if ( indefinite( num ) || num >= 0 )
        return num;

    throw std::runtime_error( "expecting '-1' or positive number with option '" + opt + "', got '" + arg + "' (try option --help)" );
}